

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O0

sat_solver * Sbm_AddCardinSolver(int LogN,Vec_Int_t **pvVars)

{
  int iVar1;
  Vec_Int_t *vVars_00;
  sat_solver *s;
  int n;
  sat_solver *pSat;
  Vec_Int_t *vVars;
  int nVarsReal;
  int nVarsAlloc;
  int nVars;
  Vec_Int_t **pvVars_local;
  int LogN_local;
  
  iVar1 = 1 << ((byte)LogN & 0x1f);
  n = ((iVar1 * LogN * (LogN + -1)) / 4) * 2 + iVar1 * 3 + -2;
  vVars_00 = Vec_IntStartNatural(iVar1);
  s = sat_solver_new();
  sat_solver_setnvars(s,n);
  iVar1 = Sbm_AddCardinConstrPairWise(s,vVars_00,2);
  if (iVar1 == n) {
    *pvVars = vVars_00;
    return s;
  }
  __assert_fail("nVarsReal == nVarsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatMap.c"
                ,0x160,"sat_solver *Sbm_AddCardinSolver(int, Vec_Int_t **)");
}

Assistant:

sat_solver * Sbm_AddCardinSolver( int LogN, Vec_Int_t ** pvVars )
{
    int nVars = 1 << LogN;
    int nVarsAlloc = nVars + 2 * (nVars * LogN * (LogN-1) / 4 + nVars - 1), nVarsReal;
    Vec_Int_t * vVars = Vec_IntStartNatural( nVars );
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVarsAlloc );
    nVarsReal = Sbm_AddCardinConstrPairWise( pSat, vVars, 2 );
    assert( nVarsReal == nVarsAlloc );
    *pvVars = vVars;
    return pSat;
}